

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseVariantIndex.cpp
# Opt level: O0

uint __thiscall
Indexing::HashingClauseVariantIndex::computeHashAndCountVariables
          (HashingClauseVariantIndex *this,TermList *ptl,VarCounts *varCnts,uint hash_begin)

{
  bool bVar1;
  TermList *in_RSI;
  TermList tl;
  SubtermIterator sti;
  uint hash;
  Term *t;
  undefined4 in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  Term *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  uint in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  SubtermIterator *in_stack_ffffffffffffff70;
  TermList local_78 [8];
  uint local_34;
  Term *local_30;
  TermList *local_18;
  uint local_4;
  
  local_18 = in_RSI;
  bVar1 = Kernel::TermList::isVar
                    ((TermList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  if (bVar1) {
    Kernel::TermList::var(local_18);
    local_4 = computeHashAndCountVariables
                        ((HashingClauseVariantIndex *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (VarCounts *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c);
  }
  else {
    local_30 = Kernel::TermList::term((TermList *)0x2fed67);
    bVar1 = Kernel::Term::ground((Term *)0x2fed7c);
    if (bVar1) {
      local_4 = Lib::DefaultHash::hash<Kernel::Term>
                          ((Term *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                           in_stack_ffffffffffffff4c);
    }
    else {
      local_34 = termFunctorHash((HashingClauseVariantIndex *)
                                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                 (Term *)CONCAT44(in_stack_ffffffffffffff4c,
                                                  in_stack_ffffffffffffff48),0);
      Kernel::SubtermIterator::SubtermIterator
                (in_stack_ffffffffffffff70,
                 (Term *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      while (bVar1 = Kernel::SubtermIterator::hasNext((SubtermIterator *)in_stack_ffffffffffffff58),
            bVar1) {
        local_78[0] = Kernel::SubtermIterator::next
                                ((SubtermIterator *)
                                 CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        bVar1 = Kernel::TermList::isVar
                          ((TermList *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                          );
        if (bVar1) {
          Kernel::TermList::var(local_78);
          in_stack_ffffffffffffff64 =
               computeHashAndCountVariables
                         ((HashingClauseVariantIndex *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          (uint)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                          (VarCounts *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                          ,in_stack_ffffffffffffff4c);
          local_34 = in_stack_ffffffffffffff64;
        }
        else {
          in_stack_ffffffffffffff58 = Kernel::TermList::term((TermList *)0x2fee8a);
          in_stack_ffffffffffffff54 =
               termFunctorHash((HashingClauseVariantIndex *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               (Term *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)
                               ,0);
          local_34 = in_stack_ffffffffffffff54;
        }
      }
      local_4 = local_34;
      Kernel::SubtermIterator::~SubtermIterator
                ((SubtermIterator *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    }
  }
  return local_4;
}

Assistant:

unsigned HashingClauseVariantIndex::computeHashAndCountVariables(TermList* ptl, VarCounts& varCnts, unsigned hash_begin) {
  if (ptl->isVar()) {
    return computeHashAndCountVariables(ptl->var(),varCnts,hash_begin);
  }

  Term* t = ptl->term();

  if (t->ground()) {
    // no variables to count
    // just hash the pointer
    return DefaultHash::hash(t, hash_begin);
  }

  unsigned hash = termFunctorHash(t,hash_begin);

  SubtermIterator sti(t);
  while(sti.hasNext()) {
    TermList tl = sti.next();

    if (tl.isVar()) {
      hash = computeHashAndCountVariables(tl.var(),varCnts,hash);
    } else {
      hash = termFunctorHash(tl.term(),hash);
    }
  }

  return hash;
}